

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprNeedsNoAffinityChange(Expr *p,char aff)

{
  bool bVar1;
  bool bVar2;
  bool local_22;
  bool local_21;
  int unaryMinus;
  u8 op;
  char aff_local;
  Expr *p_local;
  uint local_4;
  
  bVar1 = false;
  p_local = p;
  if (aff == 'A') {
    local_4 = 1;
  }
  else {
    while( true ) {
      bVar2 = true;
      if (p_local->op != 0xad) {
        bVar2 = p_local->op == 0xae;
      }
      if (!bVar2) break;
      if (p_local->op == 0xae) {
        bVar1 = true;
      }
      p_local = p_local->pLeft;
    }
    op = p_local->op;
    if (op == 0xb0) {
      op = p_local->op2;
    }
    if (op == 'v') {
      local_21 = !bVar1 && aff == 'B';
      local_4 = (uint)local_21;
    }
    else if (op == 0x9a) {
      local_4 = (uint)('B' < aff);
    }
    else if (op == 0x9b) {
      local_4 = (uint)((bVar1 ^ 0xffU) & 1);
    }
    else if (op == 0x9c) {
      local_4 = (uint)('B' < aff);
    }
    else if (op == 0xa8) {
      local_22 = false;
      if ('B' < aff) {
        local_22 = p_local->iColumn < 0;
      }
      local_4 = (uint)local_22;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprNeedsNoAffinityChange(const Expr *p, char aff){
  u8 op;
  int unaryMinus = 0;
  if( aff==SQLITE_AFF_BLOB ) return 1;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){
    if( p->op==TK_UMINUS ) unaryMinus = 1;
    p = p->pLeft;
  }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER: {
      return aff>=SQLITE_AFF_NUMERIC;
    }
    case TK_FLOAT: {
      return aff>=SQLITE_AFF_NUMERIC;
    }
    case TK_STRING: {
      return !unaryMinus && aff==SQLITE_AFF_TEXT;
    }
    case TK_BLOB: {
      return !unaryMinus;
    }
    case TK_COLUMN: {
      assert( p->iTable>=0 );  /* p cannot be part of a CHECK constraint */
      return aff>=SQLITE_AFF_NUMERIC && p->iColumn<0;
    }
    default: {
      return 0;
    }
  }
}